

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void dense2csr(CUPDLPcsr *csr,CUPDLPdense *dense)

{
  double dVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *pcVar3;
  cupdlp_int cVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  cVar4 = dense->nCols;
  csr->nRows = dense->nRows;
  csr->nCols = cVar4;
  pcVar2 = csr->rowMatBeg;
  *pcVar2 = 0;
  if (csr->nRows < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if (0 < csr->nCols) {
        pcVar3 = dense->data;
        iVar7 = 0;
        do {
          dVar1 = pcVar3[csr->nRows * iVar7 + (int)lVar6];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            csr->rowMatIdx[iVar5] = iVar7;
            csr->rowMatElem[iVar5] = pcVar3[csr->nRows * iVar7 + (int)lVar6];
            iVar5 = iVar5 + 1;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < csr->nCols);
      }
      pcVar2[lVar6 + 1] = iVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 < csr->nRows);
  }
  csr->nMatElem = iVar5;
  return;
}

Assistant:

void dense2csr(CUPDLPcsr *csr, CUPDLPdense *dense) {
  csr->nRows = dense->nRows;
  csr->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csr->rowMatBeg[0] = 0;
  for (iRow = 0; iRow < csr->nRows; ++iRow) {
    for (iCol = 0; iCol < csr->nCols; ++iCol) {
      if (dense->data[iCol * csr->nRows + iRow] != 0) {
        csr->rowMatIdx[nnz] = iCol;
        csr->rowMatElem[nnz] = dense->data[iCol * csr->nRows + iRow];
        ++nnz;
      }
    }
    csr->rowMatBeg[iRow + 1] = nnz;
  }
  csr->nMatElem = nnz;

  return;
}